

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O3

CSVError * __thiscall
duckdb::CSVErrorHandler::GetFirstError
          (CSVError *__return_storage_ptr__,CSVErrorHandler *this,CSVErrorType error_type)

{
  pointer pcVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  idx_t iVar4;
  idx_t iVar5;
  idx_t iVar6;
  undefined3 uVar7;
  int iVar8;
  InternalException *this_00;
  pointer pCVar9;
  string local_50;
  
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar8 != 0) {
    ::std::__throw_system_error(iVar8);
  }
  pCVar9 = (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
           super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
           super__Vector_impl_data._M_start;
  while( true ) {
    if (pCVar9 == (this->errors).super_vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>.
                  super__Vector_base<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "CSVErrorHandler::GetFirstError was called without having an appropriate error type"
                 ,"");
      InternalException::InternalException(this_00,&local_50);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (pCVar9->type == error_type) break;
    pCVar9 = pCVar9 + 1;
  }
  (__return_storage_ptr__->error_message)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error_message).field_2;
  pcVar1 = (pCVar9->error_message)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (pCVar9->error_message)._M_string_length);
  (__return_storage_ptr__->full_error_message)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->full_error_message).field_2;
  pcVar1 = (pCVar9->full_error_message)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->full_error_message,pcVar1,
             pcVar1 + (pCVar9->full_error_message)._M_string_length);
  uVar7 = *(undefined3 *)&pCVar9->field_0x41;
  uVar2 = *(undefined4 *)&pCVar9->field_0x44;
  iVar6 = pCVar9->column_idx;
  uVar3 = *(undefined4 *)((long)&pCVar9->column_idx + 4);
  __return_storage_ptr__->type = pCVar9->type;
  *(undefined3 *)&__return_storage_ptr__->field_0x41 = uVar7;
  *(undefined4 *)&__return_storage_ptr__->field_0x44 = uVar2;
  *(int *)&__return_storage_ptr__->column_idx = (int)iVar6;
  *(undefined4 *)((long)&__return_storage_ptr__->column_idx + 4) = uVar3;
  (__return_storage_ptr__->csv_row)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->csv_row).field_2;
  pcVar1 = (pCVar9->csv_row)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->csv_row,pcVar1,
             pcVar1 + (pCVar9->csv_row)._M_string_length);
  iVar6 = (pCVar9->error_info).boundary_idx;
  iVar4 = (pCVar9->error_info).lines_in_batch;
  iVar5 = (pCVar9->byte_position).index;
  __return_storage_ptr__->row_byte_position = pCVar9->row_byte_position;
  (__return_storage_ptr__->byte_position).index = iVar5;
  (__return_storage_ptr__->error_info).boundary_idx = iVar6;
  (__return_storage_ptr__->error_info).lines_in_batch = iVar4;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVErrorHandler::GetFirstError(CSVErrorType error_type) {
	lock_guard<mutex> parallel_lock(main_mutex);
	for (const auto &er : errors) {
		if (er.type == error_type) {
			return er;
		}
	}
	throw InternalException("CSVErrorHandler::GetFirstError was called without having an appropriate error type");
}